

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

qsizetype __thiscall
QDecompressHelper::readInternal(QDecompressHelper *this,char *data,qsizetype maxSize)

{
  long lVar1;
  bool bVar2;
  QDecompressHelper *in_RDX;
  qsizetype in_RSI;
  QDecompressHelper *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000010;
  char *in_stack_00000018;
  qsizetype bytesRead;
  QString *in_stack_ffffffffffffff98;
  QDecompressHelper *in_stack_ffffffffffffffa0;
  long local_48;
  QDecompressHelper *data_00;
  QDecompressHelper *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  QDecompressHelper *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)in_RDX < 1) {
    local_48 = 0;
  }
  else {
    data_00 = in_RDI;
    bVar2 = hasDataInternal(in_stack_ffffffffffffffa0);
    if (bVar2) {
      local_48 = -1;
      switch(in_RDI->contentEncoding) {
      case None:
      case Deflate:
      case GZip:
        local_48 = readZLib((QDecompressHelper *)bytesRead,in_stack_00000018,in_stack_00000010);
        break;
      case Brotli:
        local_48 = readBrotli(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                              (qsizetype)in_stack_ffffffffffffffd8);
        break;
      case Zstandard:
        local_48 = readZstandard(in_stack_ffffffffffffffd8,(char *)data_00,in_RSI);
      }
      if (local_48 == -1) {
        clear(in_RDX);
      }
      in_RDI->totalUncompressedBytes = local_48 + in_RDI->totalUncompressedBytes;
      bVar2 = isPotentialArchiveBomb(in_RDI);
      if (bVar2) {
        QCoreApplication::translate
                  (&stack0xffffffffffffffe0,"QHttp",
                   "The decompressed output exceeds the limits specified by QNetworkRequest::decompressedSafetyCheckThreshold()"
                   ,0);
        QString::operator=((QString *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        QString::~QString((QString *)0x2a9a0b);
        local_48 = -1;
      }
    }
    else {
      local_48 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_48;
}

Assistant:

qsizetype QDecompressHelper::readInternal(char *data, qsizetype maxSize)
{
    Q_ASSERT(isValid());

    if (maxSize <= 0)
        return 0;

    if (!hasDataInternal())
        return 0;

    qsizetype bytesRead = -1;
    switch (contentEncoding) {
    case None:
        Q_UNREACHABLE();
        break;
    case Deflate:
    case GZip:
        bytesRead = readZLib(data, maxSize);
        break;
    case Brotli:
        bytesRead = readBrotli(data, maxSize);
        break;
    case Zstandard:
        bytesRead = readZstandard(data, maxSize);
        break;
    }
    if (bytesRead == -1)
        clear();

    totalUncompressedBytes += bytesRead;
    if (isPotentialArchiveBomb()) {
        errorStr = QCoreApplication::translate(
                "QHttp",
                "The decompressed output exceeds the limits specified by "
                "QNetworkRequest::decompressedSafetyCheckThreshold()");
        return -1;
    }

    return bytesRead;
}